

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O0

void __thiscall
OutputBox::StartUnitaryBox(OutputBox *this,string *dataset_name,size_t n_things_todo)

{
  uint uVar1;
  uint uVar2;
  size_t n_things_todo_00;
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  ProgressBar local_118;
  allocator local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string complete_pre_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  size_t local_20;
  size_t n_things_todo_local;
  string *dataset_name_local;
  OutputBox *this_local;
  
  local_20 = n_things_todo;
  n_things_todo_local = (size_t)dataset_name;
  dataset_name_local = (string *)this;
  std::operator+(local_40,(char *)dataset_name);
  PrintData(this,local_40);
  std::__cxx11::string::~string((string *)local_40);
  uVar1 = this->pre_spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(ulong)uVar1,' ',&local_91);
  std::operator+(local_70,(char *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  n_things_todo_00 = local_20;
  uVar1 = this->bar_width_;
  uVar2 = this->pre_spaces_;
  std::__cxx11::string::string(local_138,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158," |",&local_159);
  ProgressBar::ProgressBar
            (&local_118,n_things_todo_00,1,(ulong)(uVar1 + uVar2),(string *)local_138,
             (string *)local_158);
  ProgressBar::operator=(&this->pb,&local_118);
  ProgressBar::~ProgressBar(&local_118);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_138);
  ProgressBar::Start(&this->pb);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void StartUnitaryBox(const std::string &dataset_name, const size_t n_things_todo)
    {
        PrintData(dataset_name + ":");
        std::string complete_pre_message = std::string(pre_spaces_, ' ') + "|  ";
        pb = ProgressBar(n_things_todo, 1, bar_width_ + pre_spaces_, complete_pre_message, " |");
        pb.Start();
    }